

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglversionfunctionsfactory.cpp
# Opt level: O2

QAbstractOpenGLFunctions *
QOpenGLVersionFunctionsFactory::get(QOpenGLVersionProfile *versionProfile,QOpenGLContext *context)

{
  long lVar1;
  Span *pSVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  OpenGLContextProfile OVar7;
  pair<int,_int> pVar8;
  QOpenGLContextVersionData *pQVar9;
  pair<int,_int> pVar10;
  QOpenGLFunctions_4_5_Compatibility *this;
  QOpenGLContext *pQVar11;
  char *pcVar12;
  QOpenGLVersionProfile QVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  const_iterator cVar15;
  QOpenGLVersionProfile local_68;
  QOpenGLVersionProfile vp;
  QSurfaceFormat f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (context == (QOpenGLContext *)0x0) {
    context = (QOpenGLContext *)QOpenGLContext::currentContext();
    if (context != (QOpenGLContext *)0x0) goto LAB_00162ce4;
    pcVar12 = "versionFunctions: No OpenGL context";
  }
  else {
LAB_00162ce4:
    cVar3 = QOpenGLContext::isOpenGLES();
    if (cVar3 == '\0') {
      _f = 0xaaaaaaaa;
      QOpenGLContext::format();
      vp.d = (QOpenGLVersionProfilePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QOpenGLVersionProfile::QOpenGLVersionProfile(&vp,versionProfile);
      bVar4 = QOpenGLVersionProfile::isValid(&vp);
      if (!bVar4) {
        QOpenGLVersionProfile::QOpenGLVersionProfile(&local_68,&f);
        QOpenGLVersionProfile::operator=(&vp,&local_68);
        QOpenGLVersionProfile::~QOpenGLVersionProfile(&local_68);
      }
      iVar5 = QSurfaceFormat::majorVersion();
      iVar6 = QSurfaceFormat::minorVersion();
      pVar8 = QOpenGLVersionProfile::version(&vp);
      if ((iVar5 < pVar8.first) || ((iVar5 <= pVar8.first && (iVar6 < pVar8.second)))) {
LAB_001633c5:
        QVar13.d = (QOpenGLVersionProfilePrivate *)0x0;
      }
      else {
        bVar4 = QOpenGLVersionProfile::hasProfiles(&vp);
        if (bVar4) {
          OVar7 = QOpenGLVersionProfile::profile(&vp);
          if (OVar7 == CoreProfile) goto LAB_00162daa;
LAB_00162db8:
          iVar5 = QSurfaceFormat::profile();
          if (iVar5 == 1) goto LAB_001633c5;
        }
        else {
LAB_00162daa:
          bVar4 = QOpenGLVersionProfile::isLegacyVersion(&vp);
          if (bVar4) goto LAB_00162db8;
        }
        pQVar9 = QOpenGLContextVersionData::forContext(context);
        cVar15 = QHash<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>::
                 constFindImpl<QOpenGLVersionProfile>(&pQVar9->functions,&vp);
        if (cVar15.i.d ==
            (Data<QHashPrivate::Node<QOpenGLVersionProfile,_QAbstractOpenGLFunctions_*>_> *)0x0 &&
            cVar15.i.bucket == 0) {
          pVar8 = QOpenGLVersionProfile::version(&vp);
          pVar10 = QOpenGLVersionProfile::version(&vp);
          uVar14 = (ulong)pVar10 >> 0x20;
          bVar4 = QOpenGLVersionProfile::hasProfiles(&vp);
          iVar5 = pVar8.first;
          if (bVar4) {
            OVar7 = QOpenGLVersionProfile::profile(&vp);
            if (OVar7 == CompatibilityProfile) {
              if (uVar14 == 5 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xd8);
                QOpenGLFunctions_4_5_Compatibility::QOpenGLFunctions_4_5_Compatibility(this);
              }
              else if (uVar14 == 4 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(200);
                QOpenGLFunctions_4_4_Compatibility::QOpenGLFunctions_4_4_Compatibility
                          ((QOpenGLFunctions_4_4_Compatibility *)this);
              }
              else if (uVar14 == 3 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(200);
                QOpenGLFunctions_4_3_Compatibility::QOpenGLFunctions_4_3_Compatibility
                          ((QOpenGLFunctions_4_3_Compatibility *)this);
              }
              else if (uVar14 == 2 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xc0);
                QOpenGLFunctions_4_2_Compatibility::QOpenGLFunctions_4_2_Compatibility
                          ((QOpenGLFunctions_4_2_Compatibility *)this);
              }
              else if (uVar14 == 1 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xb8);
                QOpenGLFunctions_4_1_Compatibility::QOpenGLFunctions_4_1_Compatibility
                          ((QOpenGLFunctions_4_1_Compatibility *)this);
              }
              else if (uVar14 == 0 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xb0);
                QOpenGLFunctions_4_0_Compatibility::QOpenGLFunctions_4_0_Compatibility
                          ((QOpenGLFunctions_4_0_Compatibility *)this);
              }
              else if (iVar5 == 3 && uVar14 == 3) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xa8);
                QOpenGLFunctions_3_3_Compatibility::QOpenGLFunctions_3_3_Compatibility
                          ((QOpenGLFunctions_3_3_Compatibility *)this);
              }
              else {
                if (uVar14 != 2 || iVar5 != 3) goto LAB_001633c5;
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xa0);
                QOpenGLFunctions_3_2_Compatibility::QOpenGLFunctions_3_2_Compatibility
                          ((QOpenGLFunctions_3_2_Compatibility *)this);
              }
            }
            else {
              if (OVar7 != CoreProfile) goto LAB_001633c5;
              if (uVar14 == 5 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0xa0);
                QOpenGLFunctions_4_5_Core::QOpenGLFunctions_4_5_Core
                          ((QOpenGLFunctions_4_5_Core *)this);
              }
              else if (uVar14 == 4 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x98);
                QOpenGLFunctions_4_4_Core::QOpenGLFunctions_4_4_Core
                          ((QOpenGLFunctions_4_4_Core *)this);
              }
              else if (uVar14 == 3 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x90);
                QOpenGLFunctions_4_3_Core::QOpenGLFunctions_4_3_Core
                          ((QOpenGLFunctions_4_3_Core *)this);
              }
              else if (uVar14 == 2 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x88);
                QOpenGLFunctions_4_2_Core::QOpenGLFunctions_4_2_Core
                          ((QOpenGLFunctions_4_2_Core *)this);
              }
              else if (uVar14 == 1 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x80);
                QOpenGLFunctions_4_1_Core::QOpenGLFunctions_4_1_Core
                          ((QOpenGLFunctions_4_1_Core *)this);
              }
              else if (uVar14 == 0 && iVar5 == 4) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x78);
                QOpenGLFunctions_4_0_Core::QOpenGLFunctions_4_0_Core
                          ((QOpenGLFunctions_4_0_Core *)this);
              }
              else if (iVar5 == 3 && uVar14 == 3) {
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x70);
                QOpenGLFunctions_3_3_Core::QOpenGLFunctions_3_3_Core
                          ((QOpenGLFunctions_3_3_Core *)this);
              }
              else {
                if (uVar14 != 2 || iVar5 != 3) goto LAB_001633c5;
                this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x68);
                QOpenGLFunctions_3_2_Core::QOpenGLFunctions_3_2_Core
                          ((QOpenGLFunctions_3_2_Core *)this);
              }
            }
          }
          else if (uVar14 == 1 && iVar5 == 3) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x60);
            QOpenGLFunctions_3_1::QOpenGLFunctions_3_1((QOpenGLFunctions_3_1 *)this);
          }
          else if (uVar14 == 0 && iVar5 == 3) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x90);
            QOpenGLFunctions_3_0::QOpenGLFunctions_3_0((QOpenGLFunctions_3_0 *)this);
          }
          else if (iVar5 == 2 && uVar14 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x80);
            QOpenGLFunctions_2_1::QOpenGLFunctions_2_1((QOpenGLFunctions_2_1 *)this);
          }
          else if (uVar14 == 0 && iVar5 == 2) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x78);
            QOpenGLFunctions_2_0::QOpenGLFunctions_2_0((QOpenGLFunctions_2_0 *)this);
          }
          else if (uVar14 == 5 && iVar5 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x68);
            QOpenGLFunctions_1_5::QOpenGLFunctions_1_5((QOpenGLFunctions_1_5 *)this);
          }
          else if (uVar14 == 4 && iVar5 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x60);
            QOpenGLFunctions_1_4::QOpenGLFunctions_1_4((QOpenGLFunctions_1_4 *)this);
          }
          else if (uVar14 == 3 && iVar5 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x50);
            QOpenGLFunctions_1_3::QOpenGLFunctions_1_3((QOpenGLFunctions_1_3 *)this);
          }
          else if (uVar14 == 2 && iVar5 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x40);
            QOpenGLFunctions_1_2::QOpenGLFunctions_1_2((QOpenGLFunctions_1_2 *)this);
          }
          else if (uVar14 == 1 && iVar5 == 1) {
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x30);
            QOpenGLFunctions_1_1::QOpenGLFunctions_1_1((QOpenGLFunctions_1_1 *)this);
          }
          else {
            if (uVar14 != 0 || iVar5 != 1) goto LAB_001633c5;
            this = (QOpenGLFunctions_4_5_Compatibility *)operator_new(0x20);
            QOpenGLFunctions_1_0::QOpenGLFunctions_1_0((QOpenGLFunctions_1_0 *)this);
          }
          local_68.d = (QOpenGLVersionProfilePrivate *)this;
          QAbstractOpenGLFunctions::setOwningContext(&this->super_QAbstractOpenGLFunctions,context);
          QHash<QOpenGLVersionProfile,QAbstractOpenGLFunctions*>::
          emplace<QAbstractOpenGLFunctions*const&>
                    ((QHash<QOpenGLVersionProfile,QAbstractOpenGLFunctions*> *)&pQVar9->functions,
                     &vp,(QAbstractOpenGLFunctions **)&local_68);
        }
        else {
          pSVar2 = (cVar15.i.d)->spans;
          uVar14 = cVar15.i.bucket >> 7;
          local_68.d = *(QOpenGLVersionProfilePrivate **)
                        (pSVar2[uVar14].entries
                         [pSVar2[uVar14].offsets[(uint)cVar15.i.bucket & 0x7f]].storage.data + 8);
        }
        if ((QOpenGLFunctions_4_5_Compatibility *)local_68.d ==
            (QOpenGLFunctions_4_5_Compatibility *)0x0) goto LAB_001633c5;
        pQVar11 = (QOpenGLContext *)QOpenGLContext::currentContext();
        QVar13.d = local_68.d;
        if (pQVar11 == context) {
          (**(code **)(*(long *)local_68.d + 0x10))(local_68.d);
          QVar13.d = local_68.d;
        }
      }
      QOpenGLVersionProfile::~QOpenGLVersionProfile(&vp);
      QSurfaceFormat::~QSurfaceFormat(&f);
      goto LAB_001633dc;
    }
    pcVar12 = "versionFunctions: Not supported on OpenGL ES";
  }
  _f = 2;
  QVar13.d = (QOpenGLVersionProfilePrivate *)0x0;
  QMessageLogger::warning((char *)&f,pcVar12);
LAB_001633dc:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &((QOpenGLFunctions_4_5_Compatibility *)QVar13.d)->super_QAbstractOpenGLFunctions;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractOpenGLFunctions *QOpenGLVersionFunctionsFactory::get(const QOpenGLVersionProfile &versionProfile, QOpenGLContext *context)
{
    if (!context)
        context = QOpenGLContext::currentContext();

    if (!context) {
        qWarning("versionFunctions: No OpenGL context");
        return nullptr;
    }

#if !QT_CONFIG(opengles2)
    if (context->isOpenGLES()) {
        qWarning("versionFunctions: Not supported on OpenGL ES");
        return nullptr;
    }
#endif // !QT_CONFIG(opengles2)

    const QSurfaceFormat f = context->format();

    // Ensure we have a valid version and profile. Default to context's if none specified
    QOpenGLVersionProfile vp = versionProfile;
    if (!vp.isValid())
        vp = QOpenGLVersionProfile(f);

    // Check that context is compatible with requested version
    const auto v = std::pair(f.majorVersion(), f.minorVersion());
    if (v < vp.version())
        return nullptr;

    // If this context only offers core profile functions then we can't create
    // function objects for legacy or compatibility profile requests
    if (((vp.hasProfiles() && vp.profile() != QSurfaceFormat::CoreProfile) || vp.isLegacyVersion())
        && f.profile() == QSurfaceFormat::CoreProfile)
        return nullptr;

    // Create object if suitable one not cached
    QAbstractOpenGLFunctions* funcs = nullptr;
    // TODO: replace with something else
    auto *data = QOpenGLContextVersionData::forContext(context);
    auto it = data->functions.constFind(vp);
    if (it == data->functions.constEnd()) {
        funcs = createFunctions(vp);
        if (funcs) {
            funcs->setOwningContext(context);
            data->functions.insert(vp, funcs);
        }
    } else {
        funcs = it.value();
    }

    if (funcs && QOpenGLContext::currentContext() == context)
        funcs->initializeOpenGLFunctions();

    return funcs;
}